

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.hpp
# Opt level: O1

void __thiscall xe::xml::Writer::Attribute::Attribute(Attribute *this,char *name_,string *value_)

{
  pointer pcVar1;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_11);
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  pcVar1 = (value_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value,pcVar1,pcVar1 + value_->_M_string_length);
  return;
}

Assistant:

Attribute (const char* name_, const std::string& value_) : name(name_), value(value_) {}